

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O1

int luaL_execresult(lua_State *L,int stat)

{
  TValue *pTVar1;
  int iVar2;
  size_t len;
  uint uVar3;
  char *str;
  bool bVar4;
  
  if (stat != -1) {
    uVar3 = stat & 0x7f;
    if ((int)(uVar3 * 0x1000000 + 0x1000000) < 0x2000000) {
      bVar4 = uVar3 != 0;
      uVar3 = (uint)stat >> 8 & 0xff;
      if (bVar4) {
        uVar3 = stat;
      }
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      (pTVar1->field_2).it = -(uint)(uVar3 != 0) | 0xfffffffd;
      str = "exit";
      len = 4;
    }
    else {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      (pTVar1->field_2).it = 0xffffffff;
      str = "signal";
      len = 6;
    }
    lua_pushlstring(L,str,len);
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)(int)uVar3;
    return 3;
  }
  iVar2 = luaL_fileresult(L,0,(char *)0x0);
  return iVar2;
}

Assistant:

LUALIB_API int luaL_execresult(lua_State *L, int stat)
{
  if (stat != -1) {
#if LJ_TARGET_POSIX
    if (WIFSIGNALED(stat)) {
      stat = WTERMSIG(stat);
      setnilV(L->top++);
      lua_pushliteral(L, "signal");
    } else {
      if (WIFEXITED(stat))
	stat = WEXITSTATUS(stat);
      if (stat == 0)
	setboolV(L->top++, 1);
      else
	setnilV(L->top++);
      lua_pushliteral(L, "exit");
    }
#else
    if (stat == 0)
      setboolV(L->top++, 1);
    else
      setnilV(L->top++);
    lua_pushliteral(L, "exit");
#endif
    setintV(L->top++, stat);
    return 3;
  }
  return luaL_fileresult(L, 0, NULL);
}